

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_sse2_128_32.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_scan_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  uint *puVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  parasail_result_t *ppVar11;
  __m128i *b;
  __m128i *ptr;
  __m128i *b_00;
  __m128i *__dest;
  __m128i *ptr_00;
  bool bVar12;
  int iVar13;
  __m128i *palVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  longlong extraout_RDX;
  long lVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  ulong size;
  long lVar28;
  bool bVar29;
  int iVar37;
  int iVar38;
  int iVar39;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  uint uVar49;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  __m128i c;
  __m128i c_00;
  int local_170;
  uint local_16c;
  size_t len;
  int iVar18;
  uint uVar50;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_scan_profile_sse2_128_32_cold_8();
  }
  else {
    pvVar3 = (profile->profile32).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_table_scan_profile_sse2_128_32_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_scan_profile_sse2_128_32_cold_6();
      }
      else {
        uVar40 = profile->s1Len;
        uVar23 = (ulong)uVar40;
        if ((int)uVar40 < 1) {
          parasail_sw_table_scan_profile_sse2_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_scan_profile_sse2_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_table_scan_profile_sse2_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_sw_table_scan_profile_sse2_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_table_scan_profile_sse2_128_32_cold_1();
        }
        else {
          uVar21 = uVar23 + 3;
          uVar26 = ppVar4->min;
          uVar16 = (ulong)uVar26;
          uVar25 = 0x80000000 - uVar26;
          if (uVar26 != -open && SBORROW4(uVar26,-open) == (int)(uVar26 + open) < 0) {
            uVar25 = open | 0x80000000;
          }
          iVar9 = 0x7ffffffe - ppVar4->max;
          uVar26 = (uint)uVar21 & 0x7ffffffc;
          ppVar11 = parasail_result_new_table1(uVar26,s2Len);
          if (ppVar11 != (parasail_result_t *)0x0) {
            size = uVar21 >> 2;
            ppVar11->flag = ppVar11->flag | 0x4420404;
            b = parasail_memalign___m128i(0x10,size);
            ptr = parasail_memalign___m128i(0x10,size);
            b_00 = parasail_memalign___m128i(0x10,size);
            __dest = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign___m128i(0x10,size);
            auVar80._0_4_ = -(uint)((int)((ulong)b >> 0x20) == 0 && (int)b == 0);
            auVar80._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
            auVar80._8_4_ = -(uint)((int)((ulong)b_00 >> 0x20) == 0 && (int)b_00 == 0);
            auVar80._12_4_ = -(uint)((int)__dest == 0 && (int)((ulong)__dest >> 0x20) == 0);
            iVar13 = movmskps((int)uVar16,auVar80);
            len = CONCAT44((int)(uVar16 >> 0x20),iVar13);
            if (iVar13 != 0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar25 = uVar25 + 1;
            uVar22 = (uint)size;
            iVar10 = -(gap * uVar22);
            c[1] = (longlong)ptr_00;
            c[0] = size;
            parasail_memset___m128i(b_00,c,len);
            c_00[1] = extraout_RDX;
            c_00[0] = size;
            parasail_memset___m128i(b,c_00,len);
            iVar13 = -open;
            iVar37 = -open;
            iVar38 = -open;
            iVar39 = -open;
            palVar14 = ptr_00 + (uVar22 - 1);
            uVar16 = size;
            do {
              *(int *)*palVar14 = iVar13;
              *(int *)((long)*palVar14 + 4) = iVar37;
              *(int *)(*palVar14 + 1) = iVar38;
              *(int *)((long)*palVar14 + 0xc) = iVar39;
              iVar13 = iVar13 - gap;
              iVar37 = iVar37 - gap;
              iVar38 = iVar38 - gap;
              iVar39 = iVar39 - gap;
              palVar14 = palVar14 + -1;
              iVar18 = (int)uVar16;
              uVar17 = iVar18 - 1;
              uVar16 = (ulong)uVar17;
            } while (uVar17 != 0 && 0 < iVar18);
            palVar14 = b_00 + (uVar22 - 1);
            uVar15 = (ulong)(uint)s2Len;
            lVar28 = (ulong)(uVar22 + (uVar22 == 0)) << 4;
            lVar24 = size * uVar15;
            lVar27 = 0;
            uVar16 = 0;
            local_170 = 0;
            auVar77._4_4_ = uVar25;
            auVar77._0_4_ = uVar25;
            auVar77._8_4_ = uVar25;
            auVar77._12_4_ = uVar25;
            auVar79._4_4_ = iVar9;
            auVar79._0_4_ = iVar9;
            auVar79._8_4_ = iVar9;
            auVar79._12_4_ = iVar9;
            auVar80 = auVar77;
            auVar48 = auVar77;
            local_16c = uVar25;
            do {
              iVar13 = ppVar4->mapper[(byte)s2[uVar16]];
              lVar19 = 0;
              auVar52._4_4_ = uVar25;
              auVar52._0_4_ = uVar25;
              auVar52._8_4_ = uVar25;
              auVar52._12_4_ = uVar25;
              auVar41 = (undefined1  [16])0x0;
              iVar37 = 0;
              iVar38 = (int)(*palVar14)[0];
              iVar39 = *(int *)((long)*palVar14 + 4);
              iVar18 = (int)(*palVar14)[1];
              do {
                piVar1 = (int *)((long)*b_00 + lVar19);
                iVar5 = *piVar1;
                iVar6 = piVar1[1];
                iVar7 = piVar1[2];
                iVar8 = piVar1[3];
                piVar1 = (int *)((long)*b + lVar19);
                auVar64._0_4_ = *piVar1 - gap;
                auVar64._4_4_ = piVar1[1] - gap;
                auVar64._8_4_ = piVar1[2] - gap;
                auVar64._12_4_ = piVar1[3] - gap;
                auVar62._0_4_ = iVar5 - open;
                auVar62._4_4_ = iVar6 - open;
                auVar62._8_4_ = iVar7 - open;
                auVar62._12_4_ = iVar8 - open;
                auVar63._0_4_ = -(uint)(auVar62._0_4_ < auVar64._0_4_);
                auVar63._4_4_ = -(uint)(auVar62._4_4_ < auVar64._4_4_);
                auVar63._8_4_ = -(uint)(auVar62._8_4_ < auVar64._8_4_);
                auVar63._12_4_ = -(uint)(auVar62._12_4_ < auVar64._12_4_);
                auVar64 = ~auVar63 & auVar62 | auVar64 & auVar63;
                piVar1 = (int *)((long)pvVar3 + lVar19 + (long)iVar13 * size * 0x10);
                auVar30._0_4_ = iVar37 + *piVar1;
                auVar30._4_4_ = iVar38 + piVar1[1];
                auVar30._8_4_ = iVar39 + piVar1[2];
                auVar30._12_4_ = iVar18 + piVar1[3];
                piVar1 = (int *)((long)*ptr_00 + lVar19);
                auVar42._0_4_ = auVar41._0_4_ + *piVar1;
                auVar42._4_4_ = auVar41._4_4_ + piVar1[1];
                auVar42._8_4_ = auVar41._8_4_ + piVar1[2];
                auVar42._12_4_ = auVar41._12_4_ + piVar1[3];
                auVar51._0_4_ = -(uint)(auVar42._0_4_ < auVar52._0_4_);
                auVar51._4_4_ = -(uint)(auVar42._4_4_ < auVar52._4_4_);
                auVar51._8_4_ = -(uint)(auVar42._8_4_ < auVar52._8_4_);
                auVar51._12_4_ = -(uint)(auVar42._12_4_ < auVar52._12_4_);
                auVar52 = ~auVar51 & auVar42 | auVar52 & auVar51;
                auVar41._0_4_ = -(uint)(auVar30._0_4_ < auVar64._0_4_);
                auVar41._4_4_ = -(uint)(auVar30._4_4_ < auVar64._4_4_);
                auVar41._8_4_ = -(uint)(auVar30._8_4_ < auVar64._8_4_);
                auVar41._12_4_ = -(uint)(auVar30._12_4_ < auVar64._12_4_);
                *(undefined1 (*) [16])((long)*b + lVar19) = auVar64;
                auVar41 = ~auVar41 & auVar30 | auVar64 & auVar41;
                *(undefined1 (*) [16])((long)*ptr + lVar19) = auVar41;
                lVar19 = lVar19 + 0x10;
                iVar37 = iVar5;
                iVar38 = iVar6;
                iVar39 = iVar7;
                iVar18 = iVar8;
              } while (lVar28 != lVar19);
              auVar43._0_8_ = auVar41._0_8_ << 0x20;
              auVar43._8_8_ = auVar41._8_8_ << 0x20 | auVar41._0_8_ >> 0x20;
              iVar13 = (int)(*ptr_00)[0];
              auVar57._4_4_ = *(int *)((long)*ptr_00 + 4) + auVar41._0_4_;
              auVar57._0_4_ = iVar13;
              auVar57._8_4_ = (int)(*ptr_00)[1] + auVar41._4_4_;
              auVar57._12_4_ = *(int *)((long)*ptr_00 + 0xc) + auVar41._8_4_;
              auVar31._0_4_ = -(uint)(iVar13 < auVar52._0_4_);
              auVar31._4_4_ = -(uint)(auVar57._4_4_ < auVar52._4_4_);
              auVar31._8_4_ = -(uint)(auVar57._8_4_ < auVar52._8_4_);
              auVar31._12_4_ = -(uint)(auVar57._12_4_ < auVar52._12_4_);
              auVar52 = ~auVar31 & auVar57 | auVar52 & auVar31;
              bVar29 = true;
              do {
                bVar12 = bVar29;
                auVar32._4_4_ = auVar52._0_4_ + iVar10;
                auVar32._0_4_ = uVar25;
                auVar32._8_4_ = auVar52._4_4_ + iVar10;
                auVar32._12_4_ = auVar52._8_4_ + iVar10;
                auVar53._0_4_ = -(uint)((int)uVar25 < auVar52._0_4_);
                auVar53._4_4_ = -(uint)(auVar32._4_4_ < auVar52._4_4_);
                auVar53._8_4_ = -(uint)(auVar32._8_4_ < auVar52._8_4_);
                auVar53._12_4_ = -(uint)(auVar32._12_4_ < auVar52._12_4_);
                auVar52 = ~auVar53 & auVar32 | auVar52 & auVar53;
                bVar29 = false;
              } while (bVar12);
              auVar34._4_4_ = auVar52._0_4_;
              auVar34._0_4_ = uVar25;
              auVar34._8_4_ = auVar52._4_4_;
              auVar34._12_4_ = auVar52._8_4_;
              auVar54._0_4_ = -(uint)((int)uVar25 < 0);
              auVar54._4_4_ = -(uint)(auVar34._4_4_ < auVar41._0_4_);
              auVar54._8_4_ = -(uint)(auVar34._8_4_ < auVar41._4_4_);
              auVar54._12_4_ = -(uint)(auVar34._12_4_ < auVar41._8_4_);
              auVar52 = ~auVar54 & auVar34 | auVar43 & auVar54;
              auVar44._0_4_ = -(uint)(0 < auVar52._0_4_);
              auVar44._4_4_ = -(uint)(0 < auVar52._4_4_);
              auVar44._8_4_ = -(uint)(0 < auVar52._8_4_);
              auVar44._12_4_ = -(uint)(0 < auVar52._12_4_);
              auVar44 = auVar44 & auVar52;
              lVar20 = 0;
              lVar19 = lVar27;
              do {
                auVar52 = *(undefined1 (*) [16])((long)*ptr + lVar20);
                auVar33._0_4_ = auVar34._0_4_ - gap;
                auVar33._4_4_ = auVar34._4_4_ - gap;
                auVar33._8_4_ = auVar34._8_4_ - gap;
                auVar33._12_4_ = auVar34._12_4_ - gap;
                auVar45._0_4_ = auVar44._0_4_ - open;
                auVar45._4_4_ = auVar44._4_4_ - open;
                auVar45._8_4_ = auVar44._8_4_ - open;
                auVar45._12_4_ = auVar44._12_4_ - open;
                auVar58._0_4_ = -(uint)(auVar45._0_4_ < auVar33._0_4_);
                auVar58._4_4_ = -(uint)(auVar45._4_4_ < auVar33._4_4_);
                auVar58._8_4_ = -(uint)(auVar45._8_4_ < auVar33._8_4_);
                auVar58._12_4_ = -(uint)(auVar45._12_4_ < auVar33._12_4_);
                auVar34 = auVar33 & auVar58 | ~auVar58 & auVar45;
                auVar59._0_4_ = -(uint)(auVar34._0_4_ < auVar52._0_4_);
                auVar59._4_4_ = -(uint)(auVar34._4_4_ < auVar52._4_4_);
                auVar59._8_4_ = -(uint)(auVar34._8_4_ < auVar52._8_4_);
                auVar59._12_4_ = -(uint)(auVar34._12_4_ < auVar52._12_4_);
                auVar44 = ~auVar59 & auVar34 | auVar52 & auVar59;
                auVar46._0_4_ = -(uint)(0 < auVar44._0_4_);
                auVar46._4_4_ = -(uint)(0 < auVar44._4_4_);
                auVar46._8_4_ = -(uint)(0 < auVar44._8_4_);
                auVar46._12_4_ = -(uint)(0 < auVar44._12_4_);
                auVar44 = auVar46 & auVar44;
                *(undefined1 (*) [16])((long)*b_00 + lVar20) = auVar44;
                iVar13 = auVar44._0_4_;
                auVar55._0_4_ = -(uint)(iVar13 < auVar79._0_4_);
                iVar37 = auVar44._4_4_;
                auVar55._4_4_ = -(uint)(iVar37 < auVar79._4_4_);
                iVar38 = auVar44._8_4_;
                auVar55._8_4_ = -(uint)(iVar38 < auVar79._8_4_);
                iVar39 = auVar44._12_4_;
                auVar55._12_4_ = -(uint)(iVar39 < auVar79._12_4_);
                auVar79 = ~auVar55 & auVar79 | auVar44 & auVar55;
                auVar60._0_4_ = -(uint)(iVar13 < auVar77._0_4_);
                auVar60._4_4_ = -(uint)(iVar37 < auVar77._4_4_);
                auVar60._8_4_ = -(uint)(iVar38 < auVar77._8_4_);
                auVar60._12_4_ = -(uint)(iVar39 < auVar77._12_4_);
                auVar77 = ~auVar60 & auVar44 | auVar77 & auVar60;
                piVar1 = ((ppVar11->field_4).rowcols)->score_row;
                *(int *)((long)piVar1 + lVar19) = iVar13;
                *(int *)((long)piVar1 + lVar24 * 4 + lVar19) = iVar37;
                *(int *)((long)piVar1 + lVar24 * 8 + lVar19) = iVar38;
                *(int *)((long)piVar1 + lVar24 * 0xc + lVar19) = iVar39;
                auVar56._0_4_ = -(uint)(auVar80._0_4_ < iVar13);
                auVar56._4_4_ = -(uint)(auVar80._4_4_ < iVar37);
                auVar56._8_4_ = -(uint)(auVar80._8_4_ < iVar38);
                auVar56._12_4_ = -(uint)(auVar80._12_4_ < iVar39);
                auVar80 = ~auVar56 & auVar80 | auVar44 & auVar56;
                lVar20 = lVar20 + 0x10;
                lVar19 = lVar19 + uVar15 * 4;
              } while (lVar28 != lVar20);
              auVar35._0_4_ = -(uint)(auVar48._0_4_ < auVar80._0_4_);
              auVar35._4_4_ = -(uint)(auVar48._4_4_ < auVar80._4_4_);
              iVar37 = auVar80._8_4_;
              iVar38 = auVar80._12_4_;
              auVar35._8_4_ = -(uint)(auVar48._8_4_ < iVar37);
              auVar35._12_4_ = -(uint)(auVar48._12_4_ < iVar38);
              iVar13 = movmskps((int)lVar19,auVar35);
              if (iVar13 != 0) {
                auVar47._0_4_ = -(uint)(iVar37 < auVar80._0_4_);
                auVar47._4_4_ = -(uint)(iVar38 < auVar80._4_4_);
                auVar47._8_4_ = -(uint)(0 < iVar37);
                auVar47._12_4_ = -(uint)(0 < iVar38);
                auVar48 = ~auVar47 & auVar80 >> 0x40 | auVar80 & auVar47;
                uVar17 = auVar48._4_4_;
                uVar50 = auVar48._0_4_;
                uVar49 = -(uint)((int)uVar17 < (int)uVar50);
                local_16c = ~uVar49 & uVar17 | uVar50 & uVar49;
                memcpy(__dest,b_00,size << 4);
                auVar48._4_4_ = local_16c;
                auVar48._0_4_ = local_16c;
                auVar48._8_4_ = local_16c;
                auVar48._12_4_ = local_16c;
                local_170 = (int)uVar16;
              }
              uVar16 = uVar16 + 1;
              lVar27 = lVar27 + 4;
            } while (uVar16 != uVar15);
            bVar29 = (uVar21 & 0x7ffffffc) == 0;
            if (!bVar29) {
              if (bVar29) {
                uVar26 = (uVar22 & 0x1fffffff) << 2;
                uVar16 = (ulong)uVar26;
                uVar21 = 0;
                do {
                  if ((*(uint *)((long)*__dest + uVar21 * 4) == local_16c) &&
                     (uVar40 = ((uint)uVar21 & 3) * uVar22 | (uint)(uVar21 >> 2) & 0x3fffffff,
                     (int)uVar40 < (int)uVar23)) {
                    uVar23 = (ulong)uVar40;
                  }
                  uVar40 = (uint)uVar23;
                  uVar21 = uVar21 + 1;
                } while (uVar26 != (uint)uVar21);
              }
              else {
                uVar16 = 0;
                auVar61 = _DAT_00904a60;
                uVar17 = uVar40;
                uVar49 = uVar40;
                uVar50 = uVar40;
                do {
                  puVar2 = (uint *)((long)*__dest + uVar16 * 4);
                  uVar66 = auVar61._4_4_;
                  uVar68 = auVar61._8_4_;
                  uVar70 = auVar61._12_4_;
                  auVar80 = auVar61 & _DAT_00904a70;
                  iVar13 = auVar80._4_4_;
                  auVar76._4_4_ = iVar13;
                  auVar76._0_4_ = iVar13;
                  auVar76._8_4_ = auVar80._12_4_;
                  auVar76._12_4_ = auVar80._12_4_;
                  uVar72 = auVar80._0_4_ * uVar22 + (auVar61._0_4_ >> 2);
                  uVar73 = iVar13 * uVar22 + (uVar66 >> 2);
                  uVar74 = (int)((auVar80._8_8_ & 0xffffffff) * size) + (uVar68 >> 2);
                  uVar75 = (int)((auVar76._8_8_ & 0xffffffff) * size) + (uVar70 >> 2);
                  uVar65 = -(uint)((int)uVar72 < (int)uVar40);
                  uVar67 = -(uint)((int)uVar73 < (int)uVar17);
                  uVar69 = -(uint)((int)uVar74 < (int)uVar49);
                  uVar71 = -(uint)((int)uVar75 < (int)uVar50);
                  uVar40 = ~-(uint)(*puVar2 == local_16c) & uVar40 |
                           (~uVar65 & uVar40 | uVar72 & uVar65) & -(uint)(*puVar2 == local_16c);
                  uVar17 = ~-(uint)(puVar2[1] == local_16c) & uVar17 |
                           (~uVar67 & uVar17 | uVar73 & uVar67) & -(uint)(puVar2[1] == local_16c);
                  uVar49 = ~-(uint)(puVar2[2] == local_16c) & uVar49 |
                           (~uVar69 & uVar49 | uVar74 & uVar69) & -(uint)(puVar2[2] == local_16c);
                  uVar50 = ~-(uint)(puVar2[3] == local_16c) & uVar50 |
                           (~uVar71 & uVar50 | uVar75 & uVar71) & -(uint)(puVar2[3] == local_16c);
                  uVar16 = uVar16 + 4;
                  auVar61._0_4_ = auVar61._0_4_ + 4;
                  auVar61._4_4_ = uVar66 + 4;
                  auVar61._8_4_ = uVar68 + 4;
                  auVar61._12_4_ = uVar70 + 4;
                } while (uVar26 != uVar16);
                uVar26 = ~-(uint)((int)uVar40 < (int)uVar49) & uVar49 |
                         uVar40 & -(uint)((int)uVar40 < (int)uVar49);
                uVar22 = ~-(uint)((int)uVar17 < (int)uVar50) & uVar50 |
                         uVar17 & -(uint)((int)uVar17 < (int)uVar50);
                uVar40 = -(uint)((int)uVar26 < (int)uVar22);
                uVar40 = ~uVar40 & uVar22 | uVar26 & uVar40;
              }
            }
            auVar36._0_4_ = -(uint)(auVar79._0_4_ < (int)uVar25);
            auVar36._4_4_ = -(uint)(auVar79._4_4_ < (int)uVar25);
            auVar36._8_4_ = -(uint)(auVar79._8_4_ < (int)uVar25);
            auVar36._12_4_ = -(uint)(auVar79._12_4_ < (int)uVar25);
            auVar78._0_4_ = -(uint)(iVar9 < auVar77._0_4_);
            auVar78._4_4_ = -(uint)(iVar9 < auVar77._4_4_);
            auVar78._8_4_ = -(uint)(iVar9 < auVar77._8_4_);
            auVar78._12_4_ = -(uint)(iVar9 < auVar77._12_4_);
            iVar9 = movmskps((int)uVar16,auVar78 | auVar36);
            if (iVar9 != 0) {
              *(byte *)&ppVar11->flag = (byte)ppVar11->flag | 0x40;
              local_16c = 0;
              local_170 = 0;
              uVar40 = 0;
            }
            ppVar11->score = local_16c;
            ppVar11->end_query = uVar40;
            ppVar11->end_ref = local_170;
            parasail_free(ptr_00);
            parasail_free(__dest);
            parasail_free(b_00);
            parasail_free(ptr);
            parasail_free(b);
            return ppVar11;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32_rpl(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32_rpl(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vF = _mm_max_epi32_rpl(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32_rpl(vHt, vF);
        vH = _mm_max_epi32_rpl(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32_rpl(vHt, vF);
            vH = _mm_max_epi32_rpl(vH, vZero);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32_rpl (vH, 3);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int32_t *t = (int32_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}